

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_State_PDU::Entity_State_PDU
          (Entity_State_PDU *this,EntityIdentifier *EI,ForceID ID,EntityType *Type,
          EntityType *AltType,Vector *EntityLinearVelocity,WorldCoordinates *EntityLocation,
          EulerAngles *EntityOrientation,EntityAppearance *EA,DeadReckoningParameter *DRP,
          EntityMarking *EM,EntityCapabilities *EC)

{
  Vector *EntityLinearVelocity_local;
  EntityType *AltType_local;
  EntityType *Type_local;
  ForceID ID_local;
  EntityIdentifier *EI_local;
  Entity_State_PDU *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Entity_State_PDU_0032df80;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID,EI);
  this->m_ui8ForceID = (KUINT8)ID;
  this->m_ui8NumOfVariableParams = '\0';
  DATA_TYPE::EntityType::EntityType(&this->m_EntityType,Type);
  DATA_TYPE::EntityType::EntityType(&this->m_AltEntityType,AltType);
  DATA_TYPE::Vector::Vector(&this->m_EntityLinearVelocity,EntityLinearVelocity);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_EntityLocation,EntityLocation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_EntityOrientation,EntityOrientation);
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EntityAppearance,EA);
  DATA_TYPE::DeadReckoningParameter::DeadReckoningParameter(&this->m_DeadReckoningParameter,DRP);
  DATA_TYPE::EntityMarking::EntityMarking(&this->m_EntityMarking,EM);
  DATA_TYPE::EntityCapabilities::EntityCapabilities(&this->m_EntityCapabilities,EC);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters);
  this->m_pDrCalc = (DeadReckoningCalculator *)0x0;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui8PDUType = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x90;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Entity_State_PDU::Entity_State_PDU( const EntityIdentifier & EI, ForceID ID, const EntityType & Type, const EntityType & AltType,
                                    const Vector & EntityLinearVelocity, const WorldCoordinates & EntityLocation,
                                    const EulerAngles & EntityOrientation, const EntityAppearance & EA,
                                    const DeadReckoningParameter & DRP, const EntityMarking & EM,
                                    const EntityCapabilities & EC ) :
    m_EntityID( EI ),
    m_ui8ForceID( ID ),
    m_ui8NumOfVariableParams( 0 ),
    m_EntityType( Type ),
    m_AltEntityType( AltType ),
    m_EntityLinearVelocity( EntityLinearVelocity ),
    m_EntityLocation( EntityLocation ),
    m_EntityOrientation( EntityOrientation ),
    m_EntityAppearance( EA ),
    m_DeadReckoningParameter( DRP ),
    m_EntityMarking( EM ),
    m_EntityCapabilities( EC ),
    m_pDrCalc( 0 )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = Entity_State_PDU_Type;
    m_ui16PDULength = ENTITY_STATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}